

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandit_run_policy.h
# Opt level: O2

bool __thiscall
bandit::detail::bandit_run_policy::matches_only_pattern(bandit_run_policy *this,char *name)

{
  bool bVar1;
  string n;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,name,&local_31);
  bVar1 = matches_only_pattern(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool matches_only_pattern(const char* name) const
    {
      std::string n(name);
      return matches_only_pattern(n);
    }